

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GenCADFile.cpp
# Opt level: O2

double __thiscall GenCADFile::get_padstack_radius(GenCADFile *this,mpc_ast_t *padstack_ast)

{
  int lb;
  mpc_ast_t *pmVar1;
  char *pad_name_wanted;
  int i;
  GenCADFile *this_00;
  double dVar2;
  double local_30;
  
  local_30 = 0.5;
  lb = 0;
  while (-1 < lb) {
    lb = mpc_ast_get_index_lb(padstack_ast,"padstacks_pad|>",lb);
    if ((-1 < lb) &&
       (this_00 = (GenCADFile *)padstack_ast,
       pmVar1 = mpc_ast_get_child_lb(padstack_ast,"padstacks_pad|>",lb), pmVar1 != (mpc_ast_t *)0x0)
       ) {
      pad_name_wanted = get_nonquoted_or_quoted_string_child(this_00,pmVar1,"pad_name");
      dVar2 = local_30;
      if ((pad_name_wanted != (char *)0x0) &&
         ((pmVar1 = get_pad_by_name(this,pad_name_wanted), pmVar1 != (mpc_ast_t *)0x0 &&
          (dVar2 = get_pad_radius(this,pmVar1), dVar2 <= local_30)))) {
        dVar2 = local_30;
      }
      local_30 = dVar2;
      lb = lb + 1;
    }
  }
  return local_30;
}

Assistant:

double GenCADFile::get_padstack_radius(mpc_ast_t *padstack_ast) {
	double radius = 0.5;
	// loop through all pads in a padstack and return with the greatest size
	for (int i = 0; i >= 0;) {
		i = mpc_ast_get_index_lb(padstack_ast, "padstacks_pad|>", i);
		if (i >= 0) {
			mpc_ast_t *pad_ref_ast = mpc_ast_get_child_lb(padstack_ast, "padstacks_pad|>", i);
			if (!pad_ref_ast) continue;

			char *pad_name = get_nonquoted_or_quoted_string_child(pad_ref_ast, "pad_name");
			if (pad_name) {
				mpc_ast_t *pad_ast = get_pad_by_name(pad_name);
				if (pad_ast != nullptr) {
					double pad_radius  = get_pad_radius(pad_ast);
					if (pad_radius > radius) radius = pad_radius;
				}
			}
			i++;
		}
	}
	return radius;
}